

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsInvalidTest::getValueList_abi_cxx11_
          (string *__return_storage_ptr__,ImplicitConversionsInvalidTest *this,GLuint n_rows)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (n_rows != 0) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      n_rows = n_rows - 1;
    } while (n_rows != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImplicitConversionsInvalidTest::getValueList(glw::GLuint n_rows)
{
	std::string result;

	for (GLuint i = 0; i < n_rows; ++i)
	{
		if (i != n_rows - 1)
		{
			result.append("1, ");
		}
		else
		{
			result.append("1");
		}
	}

	return result;
}